

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergePartial
               (CodedInputStream *input,Message *message)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint32 first_byte_or_zero;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FieldDescriptor *field;
  uint key;
  Descriptor *this;
  
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  this = (Descriptor *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  do {
    pbVar2 = input->buffer_;
    first_byte_or_zero = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003339d0;
      input->last_tag_ = (uint)bVar1;
      input->buffer_ = pbVar2 + 1;
    }
    else {
LAB_003339d0:
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
      input->last_tag_ = first_byte_or_zero;
    }
    bVar3 = (first_byte_or_zero & 7) == 4 || first_byte_or_zero == 0;
    if (bVar3) {
      return bVar3;
    }
    if (this == (Descriptor *)0x0) {
LAB_00333a77:
      field = (FieldDescriptor *)0x0;
LAB_00333a79:
      bVar4 = ParseAndMergeField(first_byte_or_zero,field,message,input);
    }
    else {
      key = first_byte_or_zero >> 3;
      field = Descriptor::FindFieldByNumber(this,key);
      if (field != (FieldDescriptor *)0x0) goto LAB_00333a79;
      bVar4 = Descriptor::IsExtensionNumber(this,key);
      if (bVar4) {
        if (input->extension_pool_ == (DescriptorPool *)0x0) {
          field = (FieldDescriptor *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x270))
                            ((long *)CONCAT44(extraout_var_00,iVar5),key);
        }
        else {
          field = DescriptorPool::FindExtensionByNumber(input->extension_pool_,this,key);
        }
        if (field != (FieldDescriptor *)0x0) goto LAB_00333a79;
      }
      if (first_byte_or_zero != 0xb) goto LAB_00333a77;
      field = (FieldDescriptor *)0x0;
      if (*(char *)(*(long *)(this + 0x20) + 0x68) == '\0') goto LAB_00333a79;
      bVar4 = ParseAndMergeMessageSetItem(input,message);
    }
    if (bVar4 == false) {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergePartial(io::CodedInputStream* input,
                                      Message* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  const Reflection* message_reflection = message->GetReflection();

  while(true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    if (WireFormatLite::GetTagWireType(tag) ==
        WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    const FieldDescriptor* field = NULL;

    if (descriptor != NULL) {
      int field_number = WireFormatLite::GetTagFieldNumber(tag);
      field = descriptor->FindFieldByNumber(field_number);

      // If that failed, check if the field is an extension.
      if (field == NULL && descriptor->IsExtensionNumber(field_number)) {
        if (input->GetExtensionPool() == NULL) {
          field = message_reflection->FindKnownExtensionByNumber(field_number);
        } else {
          field = input->GetExtensionPool()
                       ->FindExtensionByNumber(descriptor, field_number);
        }
      }

      // If that failed, but we're a MessageSet, and this is the tag for a
      // MessageSet item, then parse that.
      if (field == NULL &&
          descriptor->options().message_set_wire_format() &&
          tag == WireFormatLite::kMessageSetItemStartTag) {
        if (!ParseAndMergeMessageSetItem(input, message)) {
          return false;
        }
        continue;  // Skip ParseAndMergeField(); already taken care of.
      }
    }

    if (!ParseAndMergeField(tag, field, message, input)) {
      return false;
    }
  }
}